

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O3

void __thiscall
amrex::CoordSys::GetCellVolCoord
          (CoordSys *this,Vector<double,_std::allocator<double>_> *vc,Box *region,int dir)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pdVar5;
  ulong uVar6;
  int iVar7;
  
  iVar4 = (region->smallend).vect[dir];
  iVar7 = (region->bigend).vect[dir] - iVar4;
  dVar2 = this->dx[dir];
  uVar1 = iVar7 + 1;
  dVar3 = this->offset[dir];
  std::vector<double,_std::allocator<double>_>::resize
            (&vc->super_vector<double,_std::allocator<double>_>,(long)(int)uVar1);
  if (-1 < iVar7) {
    pdVar5 = (vc->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar6 = 0;
    do {
      pdVar5[uVar6] = (double)(int)uVar6 * this->dx[dir] + ((double)iVar4 + 0.5) * dVar2 + dVar3;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

void
CoordSys::GetCellVolCoord (Vector<Real>& vc,
                           const Box&   region,
                           int          dir) const
{
    //
    // In cartesian and Z direction of RZ volume coordinates
    // are identical to physical distance from axis.
    //
    GetCellLoc(vc,region,dir);
    //
    // In R direction of RZ, vol coord = (r^2)/2.
    //
#if (AMREX_SPACEDIM == 2)
    if (dir == 0 && c_sys == RZ)
    {
        int len = vc.size();
        AMREX_PRAGMA_SIMD
        for (int i = 0; i < len; i++)
        {
            Real r = vc[i];
            vc[i] = 0.5_rt*r*r;
        }
    }
#elif (AMREX_SPACEDIM == 1)
    if (c_sys == SPHERICAL) {
        int len = vc.size();
        AMREX_PRAGMA_SIMD
        for (int i = 0; i < len; i++) {
            Real r = vc[i];
            vc[i] = static_cast<Real>(FOURPI/3.)*r*r*r;
        }
    }
#endif
}